

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBasisToolsBspline.h
# Opt level: O2

void chrono::geometry::ChBasisToolsBspline::ComputeKnotUniformMultipleEnds
               (ChVectorDynamic<> *knotU,int p,double kstart,double kend)

{
  undefined1 auVar1 [16];
  Scalar *pSVar2;
  ChException *this;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 in_XMM3_Qb;
  allocator local_79;
  Scalar local_78;
  double local_70;
  double local_68;
  Scalar local_60;
  Scalar local_58;
  string local_50;
  
  lVar5 = (knotU->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (p * 2 + 2 <= lVar5) {
    uVar3 = (int)lVar5 + p * -2;
    local_68 = (double)(int)(uVar3 - 1);
    local_70 = kend - kstart;
    local_78 = kstart;
    local_60 = kend;
    for (uVar4 = 0; (~((int)uVar3 >> 0x1f) & uVar3) != uVar4; uVar4 = uVar4 + 1) {
      auVar7._0_8_ = (double)(int)uVar4 / local_68;
      auVar7._8_8_ = in_XMM3_Qb;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_70;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_78;
      auVar1 = vfmadd213sd_fma(auVar7,auVar6,auVar1);
      local_58 = auVar1._0_8_;
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)knotU,
                          (long)p + uVar4);
      *pSVar2 = local_58;
    }
    lVar5 = lVar5 << 0x20;
    for (uVar4 = 0; lVar5 = lVar5 + -0x100000000, (uint)(~(p >> 0x1f) & p) != uVar4;
        uVar4 = uVar4 + 1) {
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)knotU,uVar4)
      ;
      *pSVar2 = local_78;
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)knotU,
                          lVar5 >> 0x20);
      *pSVar2 = local_60;
    }
    return;
  }
  this = (ChException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_50,"ComputeKnotUniformMultipleEnds: knots must have size>=2*(order+1)"
             ,&local_79);
  ChException::ChException(this,&local_50);
  __cxa_throw(this,&ChException::typeinfo,ChException::~ChException);
}

Assistant:

static void ComputeKnotUniformMultipleEnds(ChVectorDynamic<>& knotU,  ///< knot vector
                                               const int p,               ///< order
                                               double kstart = 0.0,       ///< range start
                                               double kend = 1.0          ///< range end
    ) {
        if (knotU.size() < 2 * (p + 1))
            throw ChException("ComputeKnotUniformMultipleEnds: knots must have size>=2*(order+1)");

        int k = (int)knotU.size();
        // intermediate knots:
        int nik = k - 2 * p;
        for (int i = 0; i < nik; ++i) {
            knotU(p + i) = kstart + (double(i) / double(nik - 1)) * (kend - kstart);
        }
        // initial and final multiple knots:
        for (int i = 0; i < p; ++i) {
            knotU(i) = kstart;
            knotU(k - i - 1) = kend;
        }
    }